

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int xferOptimization(Parse *pParse,Table *pDest,Select *pSelect,int onError,int iDbDest)

{
  char *pcVar1;
  Column *pCVar2;
  byte bVar3;
  SrcList *pSVar4;
  sqlite3 *psVar5;
  ExprList *pEVar6;
  Schema *pSVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iCur;
  int iVar13;
  Table *pTab;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  Expr *pEVar17;
  Vdbe *p;
  ushort uVar18;
  Expr *pEVar19;
  Schema **ppSVar20;
  Op *pOVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  u16 uVar25;
  Index *pSrc;
  Column *pCVar26;
  Index *pIVar27;
  Index *local_80;
  int local_64;
  long local_60;
  int local_58;
  int local_54;
  u16 local_50;
  int local_40;
  int local_3c;
  int local_38;
  
  if (pParse->pWith != (With *)0x0) {
    return 0;
  }
  if (pSelect->pWith != (With *)0x0) {
    return 0;
  }
  if (pDest->eTabType == '\x01') {
    return 0;
  }
  if (onError == 0xb) {
    if (pDest->iPKey < 0) {
      uVar10 = 0xb;
    }
    else {
      uVar10 = (uint)pDest->keyConf;
    }
    onError = 2;
    if (uVar10 != 0xb) {
      onError = uVar10;
    }
  }
  pSVar4 = pSelect->pSrc;
  if (pSVar4->nSrc != 1) {
    return 0;
  }
  if (pSVar4->a[0].pSelect != (Select *)0x0) {
    return 0;
  }
  if (pSelect->pWhere != (Expr *)0x0) {
    return 0;
  }
  if (pSelect->pOrderBy != (ExprList *)0x0) {
    return 0;
  }
  if (pSelect->pGroupBy != (ExprList *)0x0) {
    return 0;
  }
  if (pSelect->pLimit != (Expr *)0x0) {
    return 0;
  }
  if (pSelect->pPrior != (Select *)0x0) {
    return 0;
  }
  if ((pSelect->selFlags & 1) != 0) {
    return 0;
  }
  if (pSelect->pEList->nExpr != 1) {
    return 0;
  }
  if ((pSelect->pEList->a[0].pExpr)->op != 0xb4) {
    return 0;
  }
  psVar5 = pParse->db;
  pTab = sqlite3LocateTableItem(pParse,0,pSVar4->a);
  if (pTab == (Table *)0x0) {
    return 0;
  }
  if ((pTab->tnum == pDest->tnum) && (pTab->pSchema == pDest->pSchema)) {
    return 0;
  }
  if ((char)((byte)pTab->tabFlags ^ (byte)pDest->tabFlags) < '\0') {
    return 0;
  }
  if (pTab->eTabType != '\0') {
    return 0;
  }
  if (pDest->nCol != pTab->nCol) {
    return 0;
  }
  if (pDest->iPKey != pTab->iPKey) {
    return 0;
  }
  if (((pDest->tabFlags >> 0x10 & 1) != 0) && ((pTab->tabFlags & 0x10000) == 0)) {
    return 0;
  }
  if (0 < pDest->nCol) {
    local_60 = 0;
    do {
      uVar18 = pDest->aCol[local_60].colFlags & 0x60;
      if (uVar18 != (pTab->aCol[local_60].colFlags & 0x60)) goto LAB_001b269a;
      pCVar26 = pDest->aCol + local_60;
      pCVar2 = pTab->aCol + local_60;
      if (uVar18 != 0) {
        uVar18 = pCVar2->iDflt;
        if ((((uVar18 == 0) || (pTab->eTabType != '\0')) ||
            (pEVar6 = (pTab->u).tab.pDfltList, pEVar6 == (ExprList *)0x0)) ||
           (pEVar6->nExpr < (int)(uint)uVar18)) {
          pEVar17 = (Expr *)0x0;
        }
        else {
          pEVar17 = pEVar6->a[uVar18 - 1].pExpr;
        }
        uVar18 = pCVar26->iDflt;
        if (((uVar18 == 0) || (pDest->eTabType != '\0')) ||
           ((pEVar6 = (pDest->u).tab.pDfltList, pEVar6 == (ExprList *)0x0 ||
            (pEVar6->nExpr < (int)(uint)uVar18)))) {
          pEVar19 = (Expr *)0x0;
        }
        else {
          pEVar19 = pEVar6->a[uVar18 - 1].pExpr;
        }
        iVar11 = sqlite3ExprCompare((Parse *)0x0,pEVar17,pEVar19,-1);
        if (iVar11 != 0) {
          return 0;
        }
      }
      if (pCVar26->affinity != pCVar2->affinity) goto LAB_001b269a;
      uVar18 = pCVar26->colFlags;
      if ((uVar18 >> 9 & 1) == 0) {
        pcVar14 = (char *)0x0;
      }
      else {
        pcVar14 = pCVar26->zCnName + -1;
        do {
          pcVar15 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
        } while (*pcVar15 != '\0');
        pcVar15 = pcVar14;
        if ((uVar18 & 4) != 0) {
          do {
            pcVar14 = pcVar15 + 1;
            pcVar16 = pcVar15 + 1;
            pcVar15 = pcVar14;
          } while (*pcVar16 != '\0');
        }
        pcVar14 = pcVar14 + 1;
      }
      if ((pCVar2->colFlags >> 9 & 1) == 0) {
        pcVar15 = (char *)0x0;
      }
      else {
        pcVar15 = pCVar2->zCnName + -1;
        do {
          pcVar16 = pcVar15 + 1;
          pcVar15 = pcVar15 + 1;
        } while (*pcVar16 != '\0');
        pcVar16 = pcVar15;
        if ((pCVar2->colFlags & 4) != 0) {
          do {
            pcVar15 = pcVar16 + 1;
            pcVar1 = pcVar16 + 1;
            pcVar16 = pcVar15;
          } while (*pcVar1 != '\0');
        }
        pcVar15 = pcVar15 + 1;
      }
      iVar11 = sqlite3_stricmp(pcVar14,pcVar15);
      if ((iVar11 != 0) || (((pCVar26->field_0x8 & 0xf) != 0 && ((pCVar2->field_0x8 & 0xf) == 0))))
      goto LAB_001b269a;
      if ((local_60 != 0) && ((uVar18 & 0x60) == 0)) {
        uVar18 = pCVar26->iDflt;
        if ((((uVar18 == 0) || (pDest->eTabType != '\0')) ||
            (pEVar6 = (pDest->u).tab.pDfltList, pEVar6 == (ExprList *)0x0)) ||
           (pEVar6->nExpr < (int)(uint)uVar18)) {
          pEVar17 = (Expr *)0x0;
        }
        else {
          pEVar17 = pEVar6->a[uVar18 - 1].pExpr;
        }
        uVar18 = pCVar2->iDflt;
        if (((uVar18 == 0) || (pTab->eTabType != '\0')) ||
           ((pEVar6 = (pTab->u).tab.pDfltList, pEVar6 == (ExprList *)0x0 ||
            (pEVar6->nExpr < (int)(uint)uVar18)))) {
          pEVar19 = (Expr *)0x0;
        }
        else {
          pEVar19 = pEVar6->a[uVar18 - 1].pExpr;
        }
        if (((pEVar17 == (Expr *)0x0) == (pEVar19 != (Expr *)0x0)) ||
           ((pEVar17 != (Expr *)0x0 &&
            (iVar11 = strcmp((pEVar17->u).zToken,(pEVar19->u).zToken), iVar11 != 0))))
        goto LAB_001b269a;
      }
      local_60 = local_60 + 1;
    } while (local_60 < pDest->nCol);
  }
  local_80 = pDest->pIndex;
  if (local_80 == (Index *)0x0) {
    bVar8 = false;
  }
  else {
    bVar8 = false;
    do {
      if (local_80->onError != '\0') {
        bVar8 = true;
      }
      pIVar27 = pTab->pIndex;
      while( true ) {
        if (pIVar27 == (Index *)0x0) {
          return 0;
        }
        iVar11 = xferCompatibleIndex(local_80,pIVar27);
        if (iVar11 != 0) break;
        pIVar27 = pIVar27->pNext;
      }
      if ((pIVar27->tnum == local_80->tnum) && (pTab->pSchema == pDest->pSchema)) {
        if (sqlite3Config.xTestCallback == (_func_int_int *)0x0) {
          return 0;
        }
        iVar11 = (*sqlite3Config.xTestCallback)(0x19b);
        if (iVar11 == 0) {
          return 0;
        }
      }
      local_80 = local_80->pNext;
    } while (local_80 != (Index *)0x0);
  }
  if ((pDest->pCheck == (ExprList *)0x0) ||
     (iVar11 = sqlite3ExprListCompare(pTab->pCheck,pDest->pCheck,-1), iVar11 == 0)) {
    uVar22 = psVar5->flags;
    if (((uint)uVar22 >> 0xe & 1) == 0) {
      if ((uVar22 >> 0x20 & 1) != 0) goto LAB_001b269a;
    }
    else {
      if ((uVar22 >> 0x20 & 1) != 0) {
        return 0;
      }
      if ((pDest->u).tab.pFKey != (FKey *)0x0) {
        return 0;
      }
    }
    if (pTab->pSchema == (Schema *)0x0) {
      local_54 = -0x8000;
    }
    else {
      local_54 = -1;
      ppSVar20 = &psVar5->aDb->pSchema;
      do {
        local_54 = local_54 + 1;
        pSVar7 = *ppSVar20;
        ppSVar20 = ppSVar20 + 4;
      } while (pSVar7 != pTab->pSchema);
    }
    p = sqlite3GetVdbe(pParse);
    sqlite3CodeVerifySchema(pParse,local_54);
    iVar11 = pParse->nTab;
    pParse->nTab = iVar11 + 2;
    iVar12 = autoIncBegin(pParse,iDbDest,pDest);
    if (pParse->nTempReg == '\0') {
      local_58 = pParse->nMem + 1;
      pParse->nMem = local_58;
    }
    else {
      bVar9 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar9;
      local_58 = pParse->aTempReg[bVar9];
    }
    iCur = iVar11 + 1;
    sqlite3VdbeAddOp3(p,0x4b,0,local_58,0);
    if (pParse->nTempReg == '\0') {
      local_64 = pParse->nMem + 1;
      pParse->nMem = local_64;
    }
    else {
      bVar9 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar9;
      local_64 = pParse->aTempReg[bVar9];
    }
    sqlite3OpenTable(pParse,iCur,iDbDest,pDest,0x71);
    local_38 = 0;
    if (((psVar5->mDbFlags & 4) == 0) &&
       ((((pDest->iPKey < 0 && (pDest->pIndex != (Index *)0x0)) || (bVar8)) ||
        (onError - 3U < 0xfffffffe)))) {
      iVar13 = sqlite3VdbeAddOp3(p,0x24,iCur,0,0);
      local_38 = sqlite3VdbeAddOp3(p,9,0,0,0);
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + iVar13;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = p->nOp;
    }
    if ((pTab->tabFlags & 0x80) == 0) {
      sqlite3OpenTable(pParse,iVar11,local_54,pTab,0x70);
      local_3c = sqlite3VdbeAddOp3(p,0x24,iVar11,0,0);
      if (pDest->iPKey < 0) {
        if ((pDest->pIndex == (Index *)0x0) && ((psVar5->mDbFlags & 8) == 0)) {
          iVar13 = 0x7f;
          iVar12 = iCur;
        }
        else {
          iVar13 = 0x87;
          iVar12 = iVar11;
        }
        local_40 = sqlite3VdbeAddOp3(p,iVar13,iVar12,local_64,0);
      }
      else {
        local_40 = sqlite3VdbeAddOp3(p,0x87,iVar11,local_64,0);
        if ((psVar5->mDbFlags & 4) == 0) {
          iVar13 = sqlite3VdbeAddOp3(p,0x1f,iCur,0,local_64);
          sqlite3RowidConstraint(pParse,onError,pDest);
          if (p->db->mallocFailed == '\0') {
            pOVar21 = p->aOp + iVar13;
          }
          else {
            pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar21->p2 = p->nOp;
        }
        if (0 < iVar12) {
          sqlite3VdbeAddOp3(pParse->pVdbe,0x9f,iVar12,local_64,0);
        }
      }
      local_50 = 0xa9;
      if ((psVar5->mDbFlags & 4) != 0) {
        sqlite3VdbeAddOp3(p,0x89,iCur,0,0);
        local_50 = 0x98;
      }
      sqlite3VdbeAddOp3(p,0x81,iCur,iVar11,local_64);
      sqlite3VdbeAddOp3(p,0x80,iCur,local_58,local_64);
      if ((psVar5->mDbFlags & 4) == 0) {
        sqlite3VdbeChangeP4(p,-1,(char *)pDest,-5);
      }
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = local_50;
      }
      sqlite3VdbeAddOp3(p,0x27,iVar11,local_40,0);
      sqlite3VdbeAddOp3(p,0x7a,iVar11,0,0);
      sqlite3VdbeAddOp3(p,0x7a,iCur,0,0);
    }
    else {
      sqlite3TableLock(pParse,iDbDest,pDest->tnum,'\x01',pDest->zName);
      local_3c = 0;
      sqlite3TableLock(pParse,local_54,pTab->tnum,'\0',pTab->zName);
    }
    for (pIVar27 = pDest->pIndex; pIVar27 != (Index *)0x0; pIVar27 = pIVar27->pNext) {
      pSrc = pTab->pIndex;
      while ((pSrc != (Index *)0x0 && (iVar12 = xferCompatibleIndex(pIVar27,pSrc), iVar12 == 0))) {
        pSrc = pSrc->pNext;
      }
      sqlite3VdbeAddOp3(p,0x70,iVar11,pSrc->tnum,local_54);
      sqlite3VdbeSetP4KeyInfo(pParse,pSrc);
      sqlite3VdbeAddOp3(p,0x71,iCur,pIVar27->tnum,iDbDest);
      sqlite3VdbeSetP4KeyInfo(pParse,pIVar27);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 1;
      }
      iVar12 = sqlite3VdbeAddOp3(p,0x24,iVar11,0,0);
      if ((psVar5->mDbFlags & 4) == 0) {
        if ((pTab->tabFlags & 0x80) == 0) {
LAB_001b2c89:
          uVar25 = 8;
        }
        else {
          uVar25 = (*(ushort *)&pIVar27->field_0x63 & 3) == 2 | 8;
        }
        bVar8 = false;
      }
      else {
        uVar18 = pSrc->nColumn;
        if (uVar18 != 0) {
          uVar22 = 0;
LAB_001b2bff:
          uVar23 = uVar22;
          if (pSrc->azColl[uVar22] != (char *)0x0) {
            lVar24 = 0;
            do {
              bVar9 = "BINARY"[lVar24];
              bVar3 = pSrc->azColl[uVar22][lVar24];
              if (bVar9 == bVar3) {
                if ((ulong)bVar9 == 0) goto LAB_001b2c37;
              }
              else if (""[bVar9] != ""[bVar3]) break;
              lVar24 = lVar24 + 1;
            } while( true );
          }
          goto LAB_001b2c45;
        }
        uVar23 = 0;
LAB_001b2c45:
        if ((uint)uVar23 != (uint)uVar18) goto LAB_001b2c89;
        sqlite3VdbeAddOp3(p,0x89,iCur,0,0);
        sqlite3VdbeAddOp3(p,0x81,iCur,iVar11,0);
        uVar25 = 0x98;
        bVar8 = true;
      }
      if (!bVar8) {
        sqlite3VdbeAddOp3(p,0x86,iVar11,local_58,1);
      }
      sqlite3VdbeAddOp3(p,0x8a,iCur,local_58,0);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = uVar25;
      }
      sqlite3VdbeAddOp3(p,0x27,iVar11,iVar12 + 1,0);
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + iVar12;
      }
      pOVar21->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x7a,iVar11,0,0);
      sqlite3VdbeAddOp3(p,0x7a,iCur,0,0);
    }
    if (local_3c != 0) {
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + local_3c;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = p->nOp;
    }
    if (local_64 != 0) {
      bVar9 = pParse->nTempReg;
      if ((ulong)bVar9 < 8) {
        pParse->nTempReg = bVar9 + 1;
        pParse->aTempReg[bVar9] = local_64;
      }
    }
    if (local_58 != 0) {
      bVar9 = pParse->nTempReg;
      if ((ulong)bVar9 < 8) {
        pParse->nTempReg = bVar9 + 1;
        pParse->aTempReg[bVar9] = local_58;
      }
    }
    if (local_38 == 0) {
      iVar11 = 1;
    }
    else {
      if (pParse->pAinc != (AutoincInfo *)0x0) {
        autoIncrementEnd(pParse);
      }
      iVar11 = 0;
      sqlite3VdbeAddOp3(p,0x46,0,0,0);
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + local_38;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x7a,iCur,0,0);
    }
  }
  else {
LAB_001b269a:
    iVar11 = 0;
  }
  return iVar11;
LAB_001b2c37:
  uVar22 = uVar22 + 1;
  uVar23 = (ulong)uVar18;
  if (uVar22 == uVar18) goto LAB_001b2c45;
  goto LAB_001b2bff;
}

Assistant:

static int xferOptimization(
  Parse *pParse,        /* Parser context */
  Table *pDest,         /* The table we are inserting into */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  int onError,          /* How to handle constraint errors */
  int iDbDest           /* The database of pDest */
){
  sqlite3 *db = pParse->db;
  ExprList *pEList;                /* The result set of the SELECT */
  Table *pSrc;                     /* The table in the FROM clause of SELECT */
  Index *pSrcIdx, *pDestIdx;       /* Source and destination indices */
  SrcItem *pItem;                  /* An element of pSelect->pSrc */
  int i;                           /* Loop counter */
  int iDbSrc;                      /* The database of pSrc */
  int iSrc, iDest;                 /* Cursors from source and destination */
  int addr1, addr2;                /* Loop addresses */
  int emptyDestTest = 0;           /* Address of test for empty pDest */
  int emptySrcTest = 0;            /* Address of test for empty pSrc */
  Vdbe *v;                         /* The VDBE we are building */
  int regAutoinc;                  /* Memory register used by AUTOINC */
  int destHasUniqueIdx = 0;        /* True if pDest has a UNIQUE index */
  int regData, regRowid;           /* Registers holding data and rowid */

  assert( pSelect!=0 );
  if( pParse->pWith || pSelect->pWith ){
    /* Do not attempt to process this query if there are an WITH clauses
    ** attached to it. Proceeding may generate a false "no such table: xxx"
    ** error if pSelect reads from a CTE named "xxx".  */
    return 0;
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pDest) ){
    return 0;   /* tab1 must not be a virtual table */
  }
#endif
  if( onError==OE_Default ){
    if( pDest->iPKey>=0 ) onError = pDest->keyConf;
    if( onError==OE_Default ) onError = OE_Abort;
  }
  assert(pSelect->pSrc);   /* allocated even if there is no FROM clause */
  if( pSelect->pSrc->nSrc!=1 ){
    return 0;   /* FROM clause must have exactly one term */
  }
  if( pSelect->pSrc->a[0].pSelect ){
    return 0;   /* FROM clause cannot contain a subquery */
  }
  if( pSelect->pWhere ){
    return 0;   /* SELECT may not have a WHERE clause */
  }
  if( pSelect->pOrderBy ){
    return 0;   /* SELECT may not have an ORDER BY clause */
  }
  /* Do not need to test for a HAVING clause.  If HAVING is present but
  ** there is no ORDER BY, we will get an error. */
  if( pSelect->pGroupBy ){
    return 0;   /* SELECT may not have a GROUP BY clause */
  }
  if( pSelect->pLimit ){
    return 0;   /* SELECT may not have a LIMIT clause */
  }
  if( pSelect->pPrior ){
    return 0;   /* SELECT may not be a compound query */
  }
  if( pSelect->selFlags & SF_Distinct ){
    return 0;   /* SELECT may not be DISTINCT */
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );
  if( pEList->nExpr!=1 ){
    return 0;   /* The result set must have exactly one column */
  }
  assert( pEList->a[0].pExpr );
  if( pEList->a[0].pExpr->op!=TK_ASTERISK ){
    return 0;   /* The result set must be the special operator "*" */
  }

  /* At this point we have established that the statement is of the
  ** correct syntactic form to participate in this optimization.  Now
  ** we have to check the semantics.
  */
  pItem = pSelect->pSrc->a;
  pSrc = sqlite3LocateTableItem(pParse, 0, pItem);
  if( pSrc==0 ){
    return 0;   /* FROM clause does not contain a real table */
  }
  if( pSrc->tnum==pDest->tnum && pSrc->pSchema==pDest->pSchema ){
    testcase( pSrc!=pDest ); /* Possible due to bad sqlite_schema.rootpage */
    return 0;   /* tab1 and tab2 may not be the same table */
  }
  if( HasRowid(pDest)!=HasRowid(pSrc) ){
    return 0;   /* source and destination must both be WITHOUT ROWID or not */
  }
  if( !IsOrdinaryTable(pSrc) ){
    return 0;   /* tab2 may not be a view or virtual table */
  }
  if( pDest->nCol!=pSrc->nCol ){
    return 0;   /* Number of columns must be the same in tab1 and tab2 */
  }
  if( pDest->iPKey!=pSrc->iPKey ){
    return 0;   /* Both tables must have the same INTEGER PRIMARY KEY */
  }
  if( (pDest->tabFlags & TF_Strict)!=0 && (pSrc->tabFlags & TF_Strict)==0 ){
    return 0;   /* Cannot feed from a non-strict into a strict table */
  }
  for(i=0; i<pDest->nCol; i++){
    Column *pDestCol = &pDest->aCol[i];
    Column *pSrcCol = &pSrc->aCol[i];
#ifdef SQLITE_ENABLE_HIDDEN_COLUMNS
    if( (db->mDbFlags & DBFLAG_Vacuum)==0
     && (pDestCol->colFlags | pSrcCol->colFlags) & COLFLAG_HIDDEN
    ){
      return 0;    /* Neither table may have __hidden__ columns */
    }
#endif
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    /* Even if tables t1 and t2 have identical schemas, if they contain
    ** generated columns, then this statement is semantically incorrect:
    **
    **     INSERT INTO t2 SELECT * FROM t1;
    **
    ** The reason is that generated column values are returned by the
    ** the SELECT statement on the right but the INSERT statement on the
    ** left wants them to be omitted.
    **
    ** Nevertheless, this is a useful notational shorthand to tell SQLite
    ** to do a bulk transfer all of the content from t1 over to t2.
    **
    ** We could, in theory, disable this (except for internal use by the
    ** VACUUM command where it is actually needed).  But why do that?  It
    ** seems harmless enough, and provides a useful service.
    */
    if( (pDestCol->colFlags & COLFLAG_GENERATED) !=
        (pSrcCol->colFlags & COLFLAG_GENERATED) ){
      return 0;    /* Both columns have the same generated-column type */
    }
    /* But the transfer is only allowed if both the source and destination
    ** tables have the exact same expressions for generated columns.
    ** This requirement could be relaxed for VIRTUAL columns, I suppose.
    */
    if( (pDestCol->colFlags & COLFLAG_GENERATED)!=0 ){
      if( sqlite3ExprCompare(0,
             sqlite3ColumnExpr(pSrc, pSrcCol),
             sqlite3ColumnExpr(pDest, pDestCol), -1)!=0 ){
        testcase( pDestCol->colFlags & COLFLAG_VIRTUAL );
        testcase( pDestCol->colFlags & COLFLAG_STORED );
        return 0;  /* Different generator expressions */
      }
    }
#endif
    if( pDestCol->affinity!=pSrcCol->affinity ){
      return 0;    /* Affinity must be the same on all columns */
    }
    if( sqlite3_stricmp(sqlite3ColumnColl(pDestCol),
                        sqlite3ColumnColl(pSrcCol))!=0 ){
      return 0;    /* Collating sequence must be the same on all columns */
    }
    if( pDestCol->notNull && !pSrcCol->notNull ){
      return 0;    /* tab2 must be NOT NULL if tab1 is */
    }
    /* Default values for second and subsequent columns need to match. */
    if( (pDestCol->colFlags & COLFLAG_GENERATED)==0 && i>0 ){
      Expr *pDestExpr = sqlite3ColumnExpr(pDest, pDestCol);
      Expr *pSrcExpr = sqlite3ColumnExpr(pSrc, pSrcCol);
      assert( pDestExpr==0 || pDestExpr->op==TK_SPAN );
      assert( pDestExpr==0 || !ExprHasProperty(pDestExpr, EP_IntValue) );
      assert( pSrcExpr==0 || pSrcExpr->op==TK_SPAN );
      assert( pSrcExpr==0 || !ExprHasProperty(pSrcExpr, EP_IntValue) );
      if( (pDestExpr==0)!=(pSrcExpr==0)
       || (pDestExpr!=0 && strcmp(pDestExpr->u.zToken,
                                       pSrcExpr->u.zToken)!=0)
      ){
        return 0;    /* Default values must be the same for all columns */
      }
    }
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    if( IsUniqueIndex(pDestIdx) ){
      destHasUniqueIdx = 1;
    }
    for(pSrcIdx=pSrc->pIndex; pSrcIdx; pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    if( pSrcIdx==0 ){
      return 0;    /* pDestIdx has no corresponding index in pSrc */
    }
    if( pSrcIdx->tnum==pDestIdx->tnum && pSrc->pSchema==pDest->pSchema
         && sqlite3FaultSim(411)==SQLITE_OK ){
      /* The sqlite3FaultSim() call allows this corruption test to be
      ** bypassed during testing, in order to exercise other corruption tests
      ** further downstream. */
      return 0;   /* Corrupt schema - two indexes on the same btree */
    }
  }
#ifndef SQLITE_OMIT_CHECK
  if( pDest->pCheck && sqlite3ExprListCompare(pSrc->pCheck,pDest->pCheck,-1) ){
    return 0;   /* Tables have different CHECK constraints.  Ticket #2252 */
  }
#endif
#ifndef SQLITE_OMIT_FOREIGN_KEY
  /* Disallow the transfer optimization if the destination table constains
  ** any foreign key constraints.  This is more restrictive than necessary.
  ** But the main beneficiary of the transfer optimization is the VACUUM
  ** command, and the VACUUM command disables foreign key constraints.  So
  ** the extra complication to make this rule less restrictive is probably
  ** not worth the effort.  Ticket [6284df89debdfa61db8073e062908af0c9b6118e]
  */
  assert( IsOrdinaryTable(pDest) );
  if( (db->flags & SQLITE_ForeignKeys)!=0 && pDest->u.tab.pFKey!=0 ){
    return 0;
  }
#endif
  if( (db->flags & SQLITE_CountRows)!=0 ){
    return 0;  /* xfer opt does not play well with PRAGMA count_changes */
  }

  /* If we get this far, it means that the xfer optimization is at
  ** least a possibility, though it might only work if the destination
  ** table (tab1) is initially empty.
  */
#ifdef SQLITE_TEST
  sqlite3_xferopt_count++;
#endif
  iDbSrc = sqlite3SchemaToIndex(db, pSrc->pSchema);
  v = sqlite3GetVdbe(pParse);
  sqlite3CodeVerifySchema(pParse, iDbSrc);
  iSrc = pParse->nTab++;
  iDest = pParse->nTab++;
  regAutoinc = autoIncBegin(pParse, iDbDest, pDest);
  regData = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp2(v, OP_Null, 0, regData);
  regRowid = sqlite3GetTempReg(pParse);
  sqlite3OpenTable(pParse, iDest, iDbDest, pDest, OP_OpenWrite);
  assert( HasRowid(pDest) || destHasUniqueIdx );
  if( (db->mDbFlags & DBFLAG_Vacuum)==0 && (
      (pDest->iPKey<0 && pDest->pIndex!=0)          /* (1) */
   || destHasUniqueIdx                              /* (2) */
   || (onError!=OE_Abort && onError!=OE_Rollback)   /* (3) */
  )){
    /* In some circumstances, we are able to run the xfer optimization
    ** only if the destination table is initially empty. Unless the
    ** DBFLAG_Vacuum flag is set, this block generates code to make
    ** that determination. If DBFLAG_Vacuum is set, then the destination
    ** table is always empty.
    **
    ** Conditions under which the destination must be empty:
    **
    ** (1) There is no INTEGER PRIMARY KEY but there are indices.
    **     (If the destination is not initially empty, the rowid fields
    **     of index entries might need to change.)
    **
    ** (2) The destination has a unique index.  (The xfer optimization
    **     is unable to test uniqueness.)
    **
    ** (3) onError is something other than OE_Abort and OE_Rollback.
    */
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iDest, 0); VdbeCoverage(v);
    emptyDestTest = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, addr1);
  }
  if( HasRowid(pSrc) ){
    u8 insFlags;
    sqlite3OpenTable(pParse, iSrc, iDbSrc, pSrc, OP_OpenRead);
    emptySrcTest = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    if( pDest->iPKey>=0 ){
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      if( (db->mDbFlags & DBFLAG_Vacuum)==0 ){
        sqlite3VdbeVerifyAbortable(v, onError);
        addr2 = sqlite3VdbeAddOp3(v, OP_NotExists, iDest, 0, regRowid);
        VdbeCoverage(v);
        sqlite3RowidConstraint(pParse, onError, pDest);
        sqlite3VdbeJumpHere(v, addr2);
      }
      autoIncStep(pParse, regAutoinc, regRowid);
    }else if( pDest->pIndex==0 && !(db->mDbFlags & DBFLAG_VacuumInto) ){
      addr1 = sqlite3VdbeAddOp2(v, OP_NewRowid, iDest, regRowid);
    }else{
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      assert( (pDest->tabFlags & TF_Autoincrement)==0 );
    }

    if( db->mDbFlags & DBFLAG_Vacuum ){
      sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      insFlags = OPFLAG_APPEND|OPFLAG_USESEEKRESULT|OPFLAG_PREFORMAT;
    }else{
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|OPFLAG_APPEND|OPFLAG_PREFORMAT;
    }
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    if( (db->mDbFlags & DBFLAG_Vacuum)==0 ){
      sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
      insFlags &= ~OPFLAG_PREFORMAT;
    }else
#endif
    {
      sqlite3VdbeAddOp3(v, OP_RowCell, iDest, iSrc, regRowid);
    }
    sqlite3VdbeAddOp3(v, OP_Insert, iDest, regData, regRowid);
    if( (db->mDbFlags & DBFLAG_Vacuum)==0 ){
      sqlite3VdbeChangeP4(v, -1, (char*)pDest, P4_TABLE);
    }
    sqlite3VdbeChangeP5(v, insFlags);

    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }else{
    sqlite3TableLock(pParse, iDbDest, pDest->tnum, 1, pDest->zName);
    sqlite3TableLock(pParse, iDbSrc, pSrc->tnum, 0, pSrc->zName);
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    u8 idxInsFlags = 0;
    for(pSrcIdx=pSrc->pIndex; ALWAYS(pSrcIdx); pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    assert( pSrcIdx );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iSrc, pSrcIdx->tnum, iDbSrc);
    sqlite3VdbeSetP4KeyInfo(pParse, pSrcIdx);
    VdbeComment((v, "%s", pSrcIdx->zName));
    sqlite3VdbeAddOp3(v, OP_OpenWrite, iDest, pDestIdx->tnum, iDbDest);
    sqlite3VdbeSetP4KeyInfo(pParse, pDestIdx);
    sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR);
    VdbeComment((v, "%s", pDestIdx->zName));
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      /* This INSERT command is part of a VACUUM operation, which guarantees
      ** that the destination table is empty. If all indexed columns use
      ** collation sequence BINARY, then it can also be assumed that the
      ** index will be populated by inserting keys in strictly sorted
      ** order. In this case, instead of seeking within the b-tree as part
      ** of every OP_IdxInsert opcode, an OP_SeekEnd is added before the
      ** OP_IdxInsert to seek to the point within the b-tree where each key
      ** should be inserted. This is faster.
      **
      ** If any of the indexed columns use a collation sequence other than
      ** BINARY, this optimization is disabled. This is because the user
      ** might change the definition of a collation sequence and then run
      ** a VACUUM command. In that case keys may not be written in strictly
      ** sorted order.  */
      for(i=0; i<pSrcIdx->nColumn; i++){
        const char *zColl = pSrcIdx->azColl[i];
        if( sqlite3_stricmp(sqlite3StrBINARY, zColl) ) break;
      }
      if( i==pSrcIdx->nColumn ){
        idxInsFlags = OPFLAG_USESEEKRESULT|OPFLAG_PREFORMAT;
        sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
        sqlite3VdbeAddOp2(v, OP_RowCell, iDest, iSrc);
      }
    }else if( !HasRowid(pSrc) && pDestIdx->idxType==SQLITE_IDXTYPE_PRIMARYKEY ){
      idxInsFlags |= OPFLAG_NCHANGE;
    }
    if( idxInsFlags!=(OPFLAG_USESEEKRESULT|OPFLAG_PREFORMAT) ){
      sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
      if( (db->mDbFlags & DBFLAG_Vacuum)==0
       && !HasRowid(pDest)
       && IsPrimaryKeyIndex(pDestIdx)
      ){
        codeWithoutRowidPreupdate(pParse, pDest, iDest, regData);
      }
    }
    sqlite3VdbeAddOp2(v, OP_IdxInsert, iDest, regData);
    sqlite3VdbeChangeP5(v, idxInsFlags|OPFLAG_APPEND);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }
  if( emptySrcTest ) sqlite3VdbeJumpHere(v, emptySrcTest);
  sqlite3ReleaseTempReg(pParse, regRowid);
  sqlite3ReleaseTempReg(pParse, regData);
  if( emptyDestTest ){
    sqlite3AutoincrementEnd(pParse);
    sqlite3VdbeAddOp2(v, OP_Halt, SQLITE_OK, 0);
    sqlite3VdbeJumpHere(v, emptyDestTest);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
    return 0;
  }else{
    return 1;
  }
}